

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O1

HaarWavelet * __thiscall
imagestego::experimental::impl::HaarWavelet::transform(HaarWavelet *this,Mat *mat)

{
  HaarWavelet *pHVar1;
  pointer pfVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  size_type sVar3;
  long lVar4;
  size_type __n;
  future<cv::Mat> *f;
  pointer pfVar5;
  vector<cv::Mat,_std::allocator<cv::Mat>_> _planes;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> futures;
  undefined1 local_149;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_148;
  HaarWavelet *local_130;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_128;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> local_108;
  _InputArray local_f0 [4];
  _OutputArray local_90 [4];
  
  cv::Mat::Mat((Mat *)this);
  local_108.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (Mat *)0x0;
  local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_130 = this;
  if ((((_InputArray *)&in_RDX->_vptr__Sp_counted_base)->flags & 7U) == 3) {
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x1010000;
    local_90[0].super__InputArray.sz.width = 0;
    local_90[0].super__InputArray.sz.height = 0;
    local_90[0].super__InputArray.flags = 0x2050000;
    local_90[0].super__InputArray.obj = &local_148;
    local_f0[0].obj = in_RDX;
    cv::split(local_f0,local_90);
  }
  else {
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x2010000;
    local_f0[0].obj = this;
    cv::Mat::convertTo((_OutputArray *)in_RDX,(int)local_f0,1.0,0.0);
    local_f0[0].sz.width = 0;
    local_f0[0].sz.height = 0;
    local_f0[0].flags = 0x1010000;
    local_90[0].super__InputArray.sz.width = 0;
    local_90[0].super__InputArray.sz.height = 0;
    local_90[0].super__InputArray.flags = 0x2050000;
    local_90[0].super__InputArray.obj = &local_148;
    local_f0[0].obj = this;
    cv::split(local_f0,local_90);
  }
  if ((long)local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start == 0x60) {
    __n = 1;
  }
  else {
    sVar3 = 1;
    lVar4 = 0x60;
    do {
      local_90[0].super__InputArray._0_8_ =
           local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_start + lVar4;
      std::
      async<imagestego::experimental::impl::HaarWavelet::transform(cv::Mat_const&)::_lambda(cv::Mat_const&)_1_,std::reference_wrapper<cv::Mat_const>>
                ((launch)local_f0,(anon_class_1_0_00000001_for__M_head_impl *)0x3,
                 (reference_wrapper<const_cv::Mat> *)&local_149);
      std::vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>>::
      emplace_back<std::future<cv::Mat>>
                ((vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>> *)&local_108,
                 (future<cv::Mat> *)local_f0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0[0].obj !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0[0].obj);
      }
      sVar3 = sVar3 + 1;
      __n = ((long)local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
      lVar4 = lVar4 + 0x60;
    } while (sVar3 != __n);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve(&local_128,__n);
  pHVar1 = local_130;
  horizontalLifting((HaarWavelet *)local_90,
                    local_148.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                    super__Vector_impl_data._M_start);
  verticalLifting((HaarWavelet *)local_f0,(Mat *)local_90);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>(&local_128,(Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_90);
  pfVar2 = local_108.
           super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_108.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_108.super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pfVar5 = local_108.
             super__Vector_base<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      std::future<cv::Mat>::get((future<cv::Mat> *)local_f0);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
                (&local_128,(Mat *)local_f0);
      cv::Mat::~Mat((Mat *)local_f0);
      pfVar5 = pfVar5 + 1;
    } while (pfVar5 != pfVar2);
  }
  local_f0[0].sz.width = 0;
  local_f0[0].sz.height = 0;
  local_f0[0].flags = 0x1050000;
  local_90[0].super__InputArray.sz.width = 0;
  local_90[0].super__InputArray.sz.height = 0;
  local_90[0].super__InputArray.flags = 0x2010000;
  local_90[0].super__InputArray.obj = pHVar1;
  local_f0[0].obj = &local_128;
  cv::merge(local_f0,local_90);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_148);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_128);
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::~vector(&local_108);
  return pHVar1;
}

Assistant:

cv::Mat transform(const cv::Mat& mat) {
        cv::Mat dst;
        std::vector<std::future<cv::Mat>> futures;
        std::vector<cv::Mat> planes, _planes;
        if (mat.depth() != CV_16S) {
            mat.convertTo(dst, CV_16S);
            cv::split(dst, _planes);
        } else {
            cv::split(mat, _planes);
        }

        for (std::size_t i = 1; i != _planes.size(); ++i) {
            futures.emplace_back(std::async(
                [](const cv::Mat& mat) -> cv::Mat {
                    return verticalLifting(horizontalLifting(mat));
                },
                std::cref(_planes[i])));
        }
        planes.reserve(_planes.size());
        planes.emplace_back(verticalLifting(horizontalLifting(_planes.front())));
        for (auto&& f : futures) {
            planes.emplace_back(f.get());
        }
        cv::merge(planes, dst);
        return dst;
    }